

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void edition_unittest::TestChildExtensionData::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  size_t sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  Arena *pAVar5;
  char *extraout_RDX;
  char *pcVar6;
  uint unaff_EBP;
  MessageLite *pMVar7;
  MessageLite *pMVar8;
  Arena *arena;
  string_view value;
  string_view value_00;
  
  pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  arena = pAVar5;
  if (((ulong)pAVar5 & 1) != 0) {
    arena = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pMVar7 = to_msg;
    pMVar8 = from_msg;
    MergeImpl();
    pcVar6 = extraout_RDX;
LAB_00c25fff:
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
LAB_00c25f47:
    value._M_str = pcVar6;
    value._M_len = (size_t)pMVar7;
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)pMVar8,value,pAVar5);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 7) == 0) goto LAB_00c25faa;
    if ((unaff_EBP & 1) != 0) {
      puVar3 = (undefined8 *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      pcVar6 = (char *)*puVar3;
      pMVar7 = (MessageLite *)puVar3[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      pMVar8 = (MessageLite *)&to_msg[1]._internal_metadata_;
      if (((ulong)pAVar5 & 1) != 0) goto LAB_00c25fff;
      goto LAB_00c25f47;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    puVar3 = (undefined8 *)((ulong)from_msg[2]._vptr_MessageLite & 0xfffffffffffffffc);
    pcVar6 = (char *)*puVar3;
    sVar1 = puVar3[1];
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    value_00._M_str = pcVar6;
    value_00._M_len = sVar1;
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(to_msg + 2),value_00,pAVar5);
  }
  if ((unaff_EBP & 4) != 0) {
    pMVar8 = (MessageLite *)from_msg[2]._internal_metadata_.ptr_;
    if (pMVar8 == (MessageLite *)0x0) {
      MergeImpl((TestChildExtensionData *)&stack0xffffffffffffffd0);
    }
    pMVar7 = (MessageLite *)to_msg[2]._internal_metadata_.ptr_;
    if (pMVar7 == (MessageLite *)0x0) {
      pvVar4 = google::protobuf::Arena::
               CopyConstruct<edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData>
                         (arena,pMVar8);
      to_msg[2]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
    }
    else {
      TestChildExtensionData_NestedTestAllExtensionsData::MergeImpl(pMVar7,pMVar8);
    }
  }
LAB_00c25faa:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void TestChildExtensionData::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestChildExtensionData*>(&to_msg);
  auto& from = static_cast<const TestChildExtensionData&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestChildExtensionData)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_a(from._internal_a());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_b(from._internal_b());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_extension_ != nullptr);
      if (_this->_impl_.optional_extension_ == nullptr) {
        _this->_impl_.optional_extension_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_extension_);
      } else {
        _this->_impl_.optional_extension_->MergeFrom(*from._impl_.optional_extension_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}